

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSparseSDF.h
# Opt level: O0

uint HsiehHash<6>(void *pdata)

{
  uint uVar1;
  int i;
  uint tmp;
  uint hash;
  unsigned_short *data;
  void *pdata_local;
  
  hash = 0x18;
  data = (unsigned_short *)pdata;
  for (i = 0; i < 6; i = i + 1) {
    uVar1 = (*data + hash) * 0x10000 ^ (uint)data[1] << 0xb ^ *data + hash;
    data = data + 2;
    hash = (uVar1 >> 0xb) + uVar1;
  }
  uVar1 = hash << 3 ^ hash;
  uVar1 = (uVar1 >> 5) + uVar1;
  uVar1 = uVar1 * 0x10 ^ uVar1;
  uVar1 = (uVar1 >> 0x11) + uVar1;
  uVar1 = uVar1 * 0x2000000 ^ uVar1;
  return (uVar1 >> 6) + uVar1;
}

Assistant:

unsigned int HsiehHash(const void* pdata)
{
	const unsigned short*	data=(const unsigned short*)pdata;
	unsigned				hash=DWORDLEN<<2,tmp;
	for(int i=0;i<DWORDLEN;++i)
	{
		hash	+=	data[0];
		tmp		=	(data[1]<<11)^hash;
		hash	=	(hash<<16)^tmp;
		data	+=	2;
		hash	+=	hash>>11;
	}
	hash^=hash<<3;hash+=hash>>5;
	hash^=hash<<4;hash+=hash>>17;
	hash^=hash<<25;hash+=hash>>6;
	return(hash);
}